

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O1

line_t_conflict * __thiscall FBlockLinesIterator::Next(FBlockLinesIterator *this)

{
  int iVar1;
  int iVar2;
  FPolyObj *pFVar3;
  int *piVar4;
  polyblock_t *ppVar5;
  long lVar6;
  line_t_conflict *plVar7;
  
  do {
    iVar2 = validcount;
    ppVar5 = this->polyLink;
LAB_0041a234:
    if (ppVar5 != (polyblock_t *)0x0) {
      iVar1 = this->polyIndex;
      do {
        pFVar3 = ppVar5->polyobj;
        if (pFVar3 != (FPolyObj *)0x0) {
          if (iVar1 != 0) goto LAB_0041a266;
          if (pFVar3->validcount != iVar2) goto LAB_0041a260;
        }
        ppVar5 = ppVar5->next;
        this->polyLink = ppVar5;
        if (ppVar5 == (polyblock_t *)0x0) break;
      } while( true );
    }
    plVar7 = lines;
    if (this->list != (int *)0x0) {
      piVar4 = this->list;
      while( true ) {
        lVar6 = (long)*piVar4;
        if (lVar6 == -1) break;
        this->list = piVar4 + 1;
        piVar4 = piVar4 + 1;
        if (plVar7[lVar6].validcount != validcount) {
          plVar7 = plVar7 + lVar6;
          plVar7->validcount = validcount;
          return plVar7;
        }
      }
    }
    iVar2 = this->curx;
    this->curx = iVar2 + 1;
    if (this->maxx <= iVar2) {
      iVar2 = this->cury;
      this->curx = this->minx;
      this->cury = iVar2 + 1;
      if (this->maxy <= iVar2) {
        return (line_t_conflict *)0x0;
      }
    }
    StartBlock(this,this->curx,this->cury);
  } while( true );
LAB_0041a260:
  pFVar3->validcount = iVar2;
LAB_0041a266:
  plVar7 = (pFVar3->Linedefs).Array[iVar1];
  this->polyIndex = iVar1 + 1;
  if ((int)(pFVar3->Linedefs).Count <= iVar1 + 1) {
    ppVar5 = ppVar5->next;
    this->polyLink = ppVar5;
    this->polyIndex = 0;
  }
  if (plVar7->validcount != iVar2) {
    plVar7->validcount = iVar2;
    return plVar7;
  }
  goto LAB_0041a234;
}

Assistant:

line_t *FBlockLinesIterator::Next()
{
	while (true)
	{
		while (polyLink != NULL)
		{
			if (polyLink->polyobj)
			{
				if (polyIndex == 0)
				{
					if (polyLink->polyobj->validcount == validcount)
					{
						polyLink = polyLink->next;
						continue;
					}
					polyLink->polyobj->validcount = validcount;
				}

				line_t *ld = polyLink->polyobj->Linedefs[polyIndex];

				if (++polyIndex >= (int)polyLink->polyobj->Linedefs.Size())
				{
					polyLink = polyLink->next;
					polyIndex = 0;
				}

				if (ld->validcount == validcount)
				{
					continue;
				}
				else
				{
					ld->validcount = validcount;
					return ld;
				}
			}
			else polyLink = polyLink->next;
		}

		if (list != NULL)
		{
			while (*list != -1)
			{
				line_t *ld = &lines[*list];

				list++;
				if (ld->validcount != validcount)
				{
					ld->validcount = validcount;
					return ld;
				}
			}
		}

		if (++curx > maxx)
		{
			curx = minx;
			if (++cury > maxy) return NULL;
		}
		StartBlock(curx, cury);
	}
}